

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::
markHostBufferUpdated(ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  element_type *peVar1;
  element_type *peVar2;
  
  this->hostBufferIsPopulated = true;
  peVar1 = (this->renderAttributeBuffer).
           super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 != (element_type *)0x0) {
    (*peVar1->_vptr_AttributeBuffer[9])(peVar1,this->data);
    requestRedraw();
  }
  peVar2 = (this->renderTextureBuffer).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    (*peVar2->_vptr_TextureBuffer[0xc])(peVar2,this->data);
    requestRedraw();
  }
  if (this->deviceBufferType != Attribute) {
    return;
  }
  updateIndexedViews(this);
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::markHostBufferUpdated() {
  hostBufferIsPopulated = true;

  // If the data is stored in the device-side buffers, update it as needed
  if (renderAttributeBuffer) {
    renderAttributeBuffer->setData(data);
    requestRedraw();
  }

  if (renderTextureBuffer) {
    renderTextureBuffer->setData(data);
    requestRedraw();
  }

  if (deviceBufferType == DeviceBufferType::Attribute) {
    updateIndexedViews();
    requestRedraw();
  }
}